

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall cmCacheManager::CacheIterator::PropertyExists(CacheIterator *this,string *prop)

{
  _Base_ptr p_Var1;
  char *pcVar2;
  
  p_Var1 = (this->Position)._M_node;
  if ((_Rb_tree_header *)p_Var1 != &(this->Container->Cache)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = CacheEntry::GetProperty((CacheEntry *)(p_Var1 + 2),prop);
    return pcVar2 != (char *)0x0;
  }
  return false;
}

Assistant:

bool cmCacheManager::CacheIterator::IsAtEnd() const
{
  return this->Position == this->Container.Cache.end();
}